

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

bool __thiscall wasm::DataFlow::Node::operator==(Node *this,Node *other)

{
  pointer ppNVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this->type == other->type) {
    switch(this->type) {
    case Var:
    case Block:
      return this == other;
    case Expr:
      bVar3 = ExpressionAnalyzer::equal((this->field_1).expr,(other->field_1).expr);
      if (!bVar3) goto LAB_009c0ff7;
      break;
    case Cond:
      if ((this->field_1).index != (other->field_1).index) goto LAB_009c0ff7;
    }
    uVar4 = 0;
    bVar3 = false;
    if ((long)(this->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(other->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(other->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      do {
        uVar6 = (ulong)uVar4;
        ppNVar1 = (this->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->values).
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3;
        bVar3 = uVar5 <= uVar6;
        if (uVar5 <= uVar6) {
          return bVar3;
        }
        bVar2 = operator!=(ppNVar1[uVar6],
                           (other->values).
                           super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar6]);
        uVar4 = uVar4 + 1;
      } while (!bVar2);
    }
  }
  else {
LAB_009c0ff7:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Node& other) {
    if (type != other.type) {
      return false;
    }
    switch (type) {
      case Var:
      case Block:
        return this == &other;
      case Expr: {
        if (!ExpressionAnalyzer::equal(expr, other.expr)) {
          return false;
        }
        break;
      }
      case Cond: {
        if (index != other.index) {
          return false;
        }
        break;
      }
      default: {}
    }
    if (values.size() != other.values.size()) {
      return false;
    }
    for (Index i = 0; i < values.size(); i++) {
      if (*(values[i]) != *(other.values[i])) {
        return false;
      }
    }
    return true;
  }